

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_class.c
# Opt level: O1

int class_static_set(klass cls,char *key,value v)

{
  int iVar1;
  anon_union_8_4_8a094f32_for_data aVar2;
  accessor_type accessor;
  
  iVar1 = 1;
  if ((((cls != (klass)0x0) && (cls->interface != (class_interface)0x0)) && (v != (value)0x0)) &&
     ((key != (char *)0x0 && (cls->interface->static_set != (class_impl_interface_static_set)0x0))))
  {
    aVar2.key = (char *)set_get(cls->static_attributes,key);
    if (aVar2.key == (char *)0x0) {
      if (cls->accessor == ACCESSOR_TYPE_DYNAMIC) {
        accessor.id = ACCESSOR_TYPE_DYNAMIC;
        accessor.data.key = key;
      }
      else {
        accessor.id = ACCESSOR_TYPE_DYNAMIC;
        if (cls->accessor == ACCESSOR_TYPE_STATIC) {
          log_write_impl_va("metacall",0x221,"class_static_set",
                            "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/reflect/source/reflect_class.c"
                            ,LOG_LEVEL_ERROR,"Static attribute %s in class %s is not defined",key,
                            cls->name);
          return 3;
        }
      }
    }
    else {
      accessor.id = ACCESSOR_TYPE_STATIC;
      accessor.data.key = aVar2.key;
    }
    iVar1 = (*cls->interface->static_set)(cls,cls->impl,&accessor,v);
    if (iVar1 == 0) {
      iVar1 = 0;
    }
    else {
      log_write_impl_va("metacall",0x234,"class_static_set",
                        "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/reflect/source/reflect_class.c"
                        ,LOG_LEVEL_ERROR,"Invalid class %s set of static attribute %s",cls->name,key
                       );
      iVar1 = 2;
    }
  }
  return iVar1;
}

Assistant:

int class_static_set(klass cls, const char *key, value v)
{
	if (cls != NULL && cls->interface != NULL && cls->interface->static_set != NULL && key != NULL && v != NULL)
	{
		struct accessor_type accessor;
		attribute attr = set_get(cls->static_attributes, (set_key)key);

		if (attr == NULL)
		{
			switch (cls->accessor)
			{
				case ACCESSOR_TYPE_STATIC: {
					log_write("metacall", LOG_LEVEL_ERROR, "Static attribute %s in class %s is not defined", key, cls->name);
					return 3;
				}

				case ACCESSOR_TYPE_DYNAMIC: {
					accessor.data.key = key;
				}
			}

			accessor.id = ACCESSOR_TYPE_DYNAMIC;
		}
		else
		{
			accessor.data.attr = attr;
			accessor.id = ACCESSOR_TYPE_STATIC;
		}

		if (cls->interface->static_set(cls, cls->impl, &accessor, v) != 0)
		{
			log_write("metacall", LOG_LEVEL_ERROR, "Invalid class %s set of static attribute %s", cls->name, key);
			return 2;
		}

		return 0;
	}

	return 1;
}